

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ssl_connection_state sVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined8 string;
  char cVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  int iVar9;
  CURLcode CVar10;
  size_t sVar11;
  size_t sVar12;
  connectdata *pcVar13;
  char *pcVar14;
  curl_llist *pcVar15;
  size_t sVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  size_t sVar20;
  char *pcVar21;
  size_t __n;
  size_t sVar22;
  char *pcVar23;
  byte *pbVar24;
  hostname *phVar25;
  ulong uVar26;
  Curl_handler *pCVar27;
  ushort **ppuVar28;
  connectbundle *pcVar29;
  long lVar30;
  curl_llist_element *pcVar31;
  long lVar32;
  connectdata *pcVar33;
  hostname *host;
  hostname *host_00;
  hostname *host_01;
  connectdata *pcVar34;
  connectdata *conn;
  SessionHandle *pSVar35;
  conncache *connc;
  byte *__s;
  ulong uVar36;
  byte bVar37;
  curl_proxytype cVar38;
  Curl_handler **ppCVar39;
  byte *__s_00;
  bool bVar40;
  bool bVar41;
  _Bool _Var42;
  undefined1 auVar43 [16];
  timeval tVar44;
  long lStackY_300;
  curl_llist_element *local_2b0;
  __suseconds_t local_2a8;
  char *passwd;
  char *user;
  connectdata *local_288;
  hostname *local_280;
  ulong local_278;
  size_t local_270;
  _Bool *local_268;
  size_t local_260;
  char *local_258;
  char *passwdp;
  ssl_config_data *local_248;
  ulong local_240;
  char protobuf [16];
  char *userp;
  undefined1 local_39;
  
  pcVar14 = (char *)0x0;
  *asyncp = false;
  user = (char *)0x0;
  passwd = (char *)0x0;
  sVar11 = Curl_multi_max_host_connections(data->multi);
  sVar12 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_268 = asyncp;
  if ((data->change).url == (char *)0x0) {
    CVar8 = CURLE_URL_MALFORMAT;
    goto LAB_0044ebc7;
  }
  local_270 = sVar11;
  local_260 = sVar12;
  pcVar13 = (connectdata *)(*Curl_ccalloc)(1,0x5a0);
  CVar8 = CURLE_OUT_OF_MEMORY;
  if (pcVar13 == (connectdata *)0x0) {
    pcVar14 = (char *)0x0;
    goto LAB_0044ebc7;
  }
  pcVar13->handler = &Curl_handler_dummy;
  pcVar13->connection_id = -1;
  pcVar13->port = -1;
  pcVar13->remote_port = -1;
  pcVar13->sock[0] = -1;
  pcVar13->sock[1] = -1;
  pcVar13->tempsock[0] = -1;
  pcVar13->tempsock[1] = -1;
  (pcVar13->bits).close = true;
  tVar44 = curlx_tvnow();
  pcVar13->created = tVar44;
  pcVar13->data = data;
  cVar38 = (data->set).proxytype;
  pcVar13->proxytype = cVar38;
  pcVar14 = (data->set).str[0xf];
  if (pcVar14 == (char *)0x0) {
    (pcVar13->bits).proxy = false;
LAB_0044e8e2:
    _Var42 = false;
  }
  else {
    bVar41 = *pcVar14 == '\0';
    (pcVar13->bits).proxy = !bVar41;
    if (bVar41) goto LAB_0044e8e2;
    if (cVar38 == CURLPROXY_HTTP) {
      _Var42 = true;
    }
    else {
      _Var42 = cVar38 == CURLPROXY_HTTP_1_0;
    }
  }
  (pcVar13->bits).httpproxy = _Var42;
  (pcVar13->bits).proxy_user_passwd = (data->set).str[0x1f] != (char *)0x0;
  (pcVar13->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar13->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
  (pcVar13->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar13->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  pcVar13->verifypeer = (data->set).ssl.verifypeer;
  pcVar13->verifyhost = (data->set).ssl.verifyhost;
  pcVar13->ip_version = (data->set).ipver;
  _Var42 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var42) && (pcVar13->master_buffer == (char *)0x0)) {
    pcVar14 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar13->master_buffer = pcVar14;
    if (pcVar14 != (char *)0x0) goto LAB_0044e988;
LAB_0044e9c2:
    pcVar14 = (char *)0x0;
    Curl_llist_destroy(pcVar13->send_pipe,(void *)0x0);
    Curl_llist_destroy(pcVar13->recv_pipe,(void *)0x0);
    pcVar13->send_pipe = (curl_llist *)0x0;
    pcVar13->recv_pipe = (curl_llist *)0x0;
    (*Curl_cfree)(pcVar13->master_buffer);
    (*Curl_cfree)(pcVar13->localdev);
    (*Curl_cfree)(pcVar13);
    goto LAB_0044ebc7;
  }
LAB_0044e988:
  pcVar15 = Curl_llist_alloc(llist_dtor);
  pcVar13->send_pipe = pcVar15;
  pcVar15 = Curl_llist_alloc(llist_dtor);
  pcVar13->recv_pipe = pcVar15;
  if (pcVar15 == (curl_llist *)0x0 || pcVar13->send_pipe == (curl_llist *)0x0) goto LAB_0044e9c2;
  pcVar14 = (data->set).str[5];
  if (pcVar14 != (char *)0x0) {
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    pcVar13->localdev = pcVar14;
    if (pcVar14 == (char *)0x0) goto LAB_0044e9c2;
  }
  pcVar13->localportrange = (data->set).localportrange;
  pcVar13->localport = (data->set).localport;
  pvVar4 = (data->set).closesocket_client;
  pcVar13->fclosesocket = (data->set).fclosesocket;
  pcVar13->closesocket_client = pvVar4;
  *in_connect = pcVar13;
  local_288 = pcVar13;
  sVar16 = strlen((data->change).url);
  sVar20 = 0x100;
  if (0x100 < sVar16) {
    sVar20 = sVar16;
  }
  (*Curl_cfree)((data->state).pathbuffer);
  (data->state).pathbuffer = (char *)0x0;
  (data->state).path = (char *)0x0;
  pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
  (data->state).pathbuffer = pcVar14;
  if (pcVar14 == (char *)0x0) {
LAB_0044ebbf:
    pcVar14 = (char *)0x0;
    goto LAB_0044ebc7;
  }
  (data->state).path = pcVar14;
  pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
  (pcVar13->host).rawalloc = pcVar14;
  if (pcVar14 == (char *)0x0) {
    (*Curl_cfree)((data->state).pathbuffer);
    (data->state).pathbuffer = (char *)0x0;
    (data->state).path = (char *)0x0;
    goto LAB_0044ebbf;
  }
  (pcVar13->host).name = pcVar14;
  *pcVar14 = '\0';
  pcVar17 = (*Curl_cstrdup)("");
  user = pcVar17;
  pcVar18 = (*Curl_cstrdup)("");
  passwd = pcVar18;
  pcVar14 = (*Curl_cstrdup)("");
  if (pcVar14 != (char *)0x0 && (pcVar18 != (char *)0x0 && pcVar17 != (char *)0x0)) {
    pcVar17 = (data->state).path;
    protobuf[0] = '\0';
    protobuf[1] = '\0';
    protobuf[2] = '\0';
    protobuf[3] = '\0';
    protobuf[4] = '\0';
    protobuf[5] = '\0';
    protobuf[6] = '\0';
    protobuf[7] = '\0';
    protobuf[8] = '\0';
    protobuf[9] = '\0';
    protobuf[10] = '\0';
    protobuf[0xb] = '\0';
    protobuf[0xc] = '\0';
    protobuf[0xd] = '\0';
    protobuf[0xe] = '\0';
    protobuf[0xf] = '\0';
    pcVar18 = (data->change).url;
    pcVar19 = strpbrk(pcVar18,"\r\n");
    if (pcVar19 != (char *)0x0) {
      pcVar17 = "Illegal characters found in URL";
LAB_0044eb84:
      Curl_failf(data,pcVar17);
      CVar8 = CURLE_URL_MALFORMAT;
      goto LAB_0044ebc7;
    }
    pcVar19 = protobuf;
    iVar9 = __isoc99_sscanf(pcVar18,"%15[^:]:%[^\n]",pcVar19,pcVar17);
    if ((iVar9 == 2) && (iVar9 = Curl_raw_equal(protobuf,"file"), iVar9 != 0)) {
      pcVar19 = "file";
      if (*pcVar17 == '/') {
        if (pcVar17[1] == '/') {
          sVar20 = strlen(pcVar17 + 2);
          memmove(pcVar17,pcVar17 + 2,sVar20 + 1);
          if (*pcVar17 != '/') goto LAB_0044ecdc;
        }
      }
      else {
LAB_0044ecdc:
        pcVar18 = strchr(pcVar17,0x2f);
        if (pcVar18 != (char *)0x0) {
          pcVar23 = pcVar18 + 1;
          if (pcVar18[1] != '/') {
            pcVar23 = pcVar18;
          }
          sVar20 = strlen(pcVar23);
          memmove(pcVar17,pcVar23,sVar20 + 1);
        }
      }
      bVar41 = false;
    }
    else {
      *pcVar17 = '\0';
      iVar9 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",pcVar19,
                              (pcVar13->host).name);
      bVar41 = false;
      if (iVar9 < 2) {
        iVar9 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar13->host).name,pcVar17);
        if (iVar9 < 1) {
          pcVar17 = "<url> malformed";
          goto LAB_0044eb84;
        }
        iVar9 = Curl_raw_nequal("FTP.",(pcVar13->host).name,4);
        bVar41 = true;
        if (iVar9 == 0) {
          iVar9 = Curl_raw_nequal("DICT.",(pcVar13->host).name,5);
          if (iVar9 == 0) {
            iVar9 = Curl_raw_nequal("LDAP.",(pcVar13->host).name,5);
            if (iVar9 == 0) {
              iVar9 = Curl_raw_nequal("IMAP.",(pcVar13->host).name,5);
              if (iVar9 == 0) {
                iVar9 = Curl_raw_nequal("SMTP.",(pcVar13->host).name,5);
                if (iVar9 == 0) {
                  iVar9 = Curl_raw_nequal("POP3.",(pcVar13->host).name,5);
                  pcVar19 = "pop3";
                  if (iVar9 == 0) {
                    pcVar19 = "http";
                  }
                }
                else {
                  pcVar19 = "smtp";
                }
              }
              else {
                pcVar19 = "IMAP";
              }
            }
            else {
              pcVar19 = "LDAP";
            }
          }
          else {
            pcVar19 = "DICT";
          }
        }
        else {
          pcVar19 = "ftp";
          bVar41 = true;
        }
      }
    }
    pcVar18 = (pcVar13->host).name;
    pcVar21 = strchr(pcVar18,0x40);
    pcVar23 = pcVar21 + 1;
    if (pcVar21 == (char *)0x0) {
      pcVar23 = pcVar18;
    }
    pcVar18 = strchr(pcVar23,0x3f);
    local_280 = (hostname *)CONCAT71(local_280._1_7_,pcVar18 != (char *)0x0);
    if (pcVar18 == (char *)0x0) {
      cVar6 = *pcVar17;
      if (cVar6 != '\0') goto LAB_0044ef0d;
      pcVar17[0] = '/';
      pcVar17[1] = '\0';
      local_280 = (hostname *)CONCAT71(local_280._1_7_,1);
LAB_0044ef46:
      if ((data->set).path_as_is == false) {
        pcVar18 = Curl_dedotdotify(pcVar17);
        if (pcVar18 == (char *)0x0) {
          CVar8 = CURLE_OUT_OF_MEMORY;
          goto LAB_0044ebc7;
        }
        iVar9 = strcmp(pcVar18,pcVar17);
        if (iVar9 != 0) {
          (*Curl_cfree)((data->state).pathbuffer);
          (data->state).pathbuffer = pcVar18;
          (data->state).path = pcVar18;
          pcVar17 = pcVar18;
          goto LAB_0044efa7;
        }
        (*Curl_cfree)(pcVar18);
      }
      if ((char)local_280 != '\0') goto LAB_0044efa7;
    }
    else {
      sVar20 = strlen(pcVar18);
      sVar16 = strlen(pcVar17);
      memmove(pcVar17 + sVar20 + 1,pcVar17,sVar16 + 1);
      memcpy(pcVar17 + 1,pcVar18,sVar20);
      *pcVar17 = '/';
      *pcVar18 = '\0';
      cVar6 = *pcVar17;
LAB_0044ef0d:
      if (cVar6 != '?') goto LAB_0044ef46;
      sVar20 = strlen(pcVar17);
      memmove(pcVar17 + 1,pcVar17,sVar20 + 1);
      *pcVar17 = '/';
LAB_0044efa7:
      sVar20 = strlen(pcVar17);
      sVar16 = strlen((data->change).url);
      __n = strlen((pcVar13->host).name);
      if (!bVar41) {
        sVar22 = strlen(pcVar19);
        __n = __n + sVar22 + 3;
      }
      pcVar18 = (char *)(*Curl_cmalloc)(sVar16 + 2);
      if (pcVar18 == (char *)0x0) {
        CVar8 = CURLE_OUT_OF_MEMORY;
        goto LAB_0044ebc7;
      }
      memcpy(pcVar18,(data->change).url,__n);
      memcpy(pcVar18 + __n,pcVar17,sVar20 + 1);
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
        (data->change).url = (char *)0x0;
        (data->change).url_alloc = false;
      }
      Curl_infof(data,"Rebuilt URL to: %s\n",pcVar18);
      (data->change).url = pcVar18;
      (data->change).url_alloc = true;
    }
    userp = (char *)0x0;
    passwdp = (char *)0x0;
    local_258 = (char *)0x0;
    pcVar18 = (pcVar13->host).name;
    pcVar23 = strchr(pcVar18,0x40);
    CVar8 = CURLE_OK;
    if (pcVar23 != (char *)0x0) {
      (pcVar13->host).name = pcVar23 + 1;
      if (((data->set).use_netrc != CURL_NETRC_REQUIRED) &&
         (CVar8 = parse_login_details(pcVar18,(size_t)(pcVar23 + 1 + ~(ulong)pcVar18),&userp,
                                      &passwdp,&local_258), CVar8 == CURLE_OK)) {
        if (userp == (char *)0x0) {
LAB_0044f16f:
          if (passwdp != (char *)0x0) {
            pcVar18 = curl_easy_unescape(data,passwdp,0,(int *)0x0);
            if (pcVar18 == (char *)0x0) goto LAB_0044f1e5;
            (*Curl_cfree)(passwd);
            passwd = pcVar18;
          }
          CVar8 = CURLE_OK;
          if (local_258 != (char *)0x0) {
            pcVar18 = curl_easy_unescape(data,local_258,0,(int *)0x0);
            if (pcVar18 == (char *)0x0) goto LAB_0044f1e5;
            (*Curl_cfree)(pcVar14);
            pcVar14 = pcVar18;
            CVar8 = CURLE_OK;
          }
        }
        else {
          (pcVar13->bits).userpwd_in_url = true;
          (pcVar13->bits).user_passwd = true;
          pcVar18 = curl_easy_unescape(data,userp,0,(int *)0x0);
          if (pcVar18 != (char *)0x0) {
            (*Curl_cfree)(user);
            user = pcVar18;
            goto LAB_0044f16f;
          }
LAB_0044f1e5:
          CVar8 = CURLE_OUT_OF_MEMORY;
        }
      }
    }
    (*Curl_cfree)(userp);
    (*Curl_cfree)(passwdp);
    (*Curl_cfree)(local_258);
    if (CVar8 != CURLE_OK) goto LAB_0044ebc7;
    pcVar18 = (pcVar13->host).name;
    if ((*pcVar18 == '[') && (pbVar24 = (byte *)strchr(pcVar18,0x25), pbVar24 != (byte *)0x0)) {
      iVar9 = *pbVar24 - 0x25;
      if ((iVar9 == 0) && (iVar9 = pbVar24[1] - 0x32, iVar9 == 0)) {
        iVar9 = 0x35 - (uint)pbVar24[2];
      }
      else {
        iVar9 = -iVar9;
      }
      if (iVar9 == 0) {
        lStackY_300 = 3;
      }
      else {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
        lStackY_300 = 1;
      }
      phVar25 = (hostname *)strtoul((char *)(pbVar24 + lStackY_300),&userp,10);
      pcVar18 = userp;
      if (*userp == ']') {
        local_280 = phVar25;
        sVar20 = strlen(userp);
        memmove(pbVar24,pcVar18,sVar20 + 1);
        pcVar13->scope_id = (uint)local_280;
      }
      else {
        Curl_infof(data,"Invalid IPv6 address format\n");
      }
    }
    uVar2 = (data->set).scope_id;
    if (uVar2 != 0) {
      pcVar13->scope_id = uVar2;
    }
    pcVar17 = strchr(pcVar17,0x23);
    if (pcVar17 != (char *)0x0) {
      *pcVar17 = '\0';
      pcVar17 = strchr((data->change).url,0x23);
      if (pcVar17 != (char *)0x0) {
        *pcVar17 = '\0';
      }
    }
    pcVar33 = local_288;
    local_280 = &local_288->host;
    ppCVar39 = protocols;
    do {
      pCVar27 = *ppCVar39;
      if (pCVar27 == (Curl_handler *)0x0) goto LAB_0044f559;
      iVar9 = Curl_raw_equal(pCVar27->scheme,pcVar19);
      ppCVar39 = ppCVar39 + 1;
    } while (iVar9 == 0);
    if ((((uint)(data->set).allowed_protocols & pCVar27->protocol) == 0) ||
       (((data->state).this_is_a_follow == true &&
        (((uint)(data->set).redir_protocols & pCVar27->protocol) == 0)))) {
LAB_0044f559:
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar19);
      CVar8 = CURLE_UNSUPPORTED_PROTOCOL;
      goto LAB_0044ebc7;
    }
    pcVar13->given = pCVar27;
    pcVar13->handler = pCVar27;
    if (bVar41) {
      pcVar17 = curl_maprintf("%s://%s",pCVar27->scheme,(data->change).url);
      if (pcVar17 == (char *)0x0) goto LAB_0044fd29;
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      (data->change).url = pcVar17;
      (data->change).url_alloc = true;
      pCVar27 = pcVar13->given;
    }
    if (((pCVar27->flags & 0x40) != 0) &&
       (pcVar17 = strchr((pcVar13->data->state).path,0x3f), pcVar17 != (char *)0x0)) {
      *pcVar17 = '\0';
    }
    pcVar17 = (data->set).str[0x27];
    if (pcVar17 != (char *)0x0) {
      pcVar17 = (*Curl_cstrdup)(pcVar17);
      pcVar13->xoauth2_bearer = pcVar17;
      if (pcVar17 == (char *)0x0) goto LAB_0044fd29;
    }
    if ((pcVar13->bits).proxy_user_passwd == true) {
      memset(protobuf,0,0x100);
      memset(&userp,0,0x100);
      pcVar17 = (data->set).str[0x1f];
      if (pcVar17 != (char *)0x0) {
        strncpy(protobuf,pcVar17,0x100);
      }
      pcVar17 = (data->set).str[0x20];
      if (pcVar17 != (char *)0x0) {
        strncpy((char *)&userp,pcVar17,0x100);
        local_39 = 0;
      }
      pcVar17 = curl_easy_unescape(data,protobuf,0,(int *)0x0);
      pcVar13->proxyuser = pcVar17;
      if (pcVar17 != (char *)0x0) {
        pcVar17 = curl_easy_unescape(data,(char *)&userp,0,(int *)0x0);
        pcVar13->proxypasswd = pcVar17;
        if (pcVar17 != (char *)0x0) goto LAB_0044f526;
      }
      goto LAB_0044fd29;
    }
LAB_0044f526:
    pcVar17 = (data->set).str[0xf];
    if (pcVar17 == (char *)0x0) {
      pbVar24 = (byte *)0x0;
    }
    else {
      pbVar24 = (byte *)(*Curl_cstrdup)(pcVar17);
      if (pbVar24 == (byte *)0x0) {
        Curl_failf(data,"memory shortage");
        goto LAB_0044fd29;
      }
    }
    pcVar17 = (data->set).str[0x21];
    if ((pcVar17 == (char *)0x0) || (_Var42 = check_noproxy((pcVar13->host).name,pcVar17), !_Var42))
    {
      if (pbVar24 != (byte *)0x0) {
LAB_0044f6aa:
        if ((*pbVar24 == 0) || ((pcVar13->handler->flags & 0x10) != 0)) goto LAB_0044f6ff;
        pcVar17 = strstr((char *)pbVar24,"://");
        __s = pbVar24;
        if (pcVar17 != (char *)0x0) {
          __s = (byte *)(pcVar17 + 3);
          iVar9 = Curl_raw_nequal("socks5h",(char *)pbVar24,7);
          if (iVar9 == 0) {
            iVar9 = Curl_raw_nequal("socks5",(char *)pbVar24,6);
            if (iVar9 == 0) {
              iVar9 = Curl_raw_nequal("socks4a",(char *)pbVar24,7);
              if (iVar9 == 0) {
                iVar9 = Curl_raw_nequal("socks4",(char *)pbVar24,6);
                cVar38 = CURLPROXY_SOCKS4;
                if ((iVar9 == 0) && (iVar9 = Curl_raw_nequal("socks",(char *)pbVar24,5), iVar9 == 0)
                   ) goto LAB_0044fd8b;
              }
              else {
                cVar38 = CURLPROXY_SOCKS4A;
              }
            }
            else {
              cVar38 = CURLPROXY_SOCKS5;
            }
          }
          else {
            cVar38 = CURLPROXY_SOCKS5_HOSTNAME;
          }
          pcVar13->proxytype = cVar38;
        }
LAB_0044fd8b:
        pcVar17 = strchr((char *)__s,0x40);
        if (pcVar17 == (char *)0x0) {
LAB_0044fdf8:
          __s_00 = __s;
          if (*__s == 0x5b) {
            __s = __s + 1;
            __s_00 = __s;
            while( true ) {
              bVar37 = *__s_00;
              if ((ulong)bVar37 == 0) break;
              ppuVar28 = __ctype_b_loc();
              if (((((*ppuVar28)[bVar37] >> 0xc & 1) == 0) && (bVar37 != 0x2e)) && (bVar37 != 0x3a))
              {
                if (bVar37 != 0x25) goto LAB_004500e5;
                if (__s_00[1] - 0x32 == 0) {
                  iVar9 = 0x35 - (uint)__s_00[2];
                }
                else {
                  iVar9 = -(__s_00[1] - 0x32);
                }
                if (iVar9 != 0) {
                  Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                }
                goto LAB_004500b1;
              }
              __s_00 = __s_00 + 1;
            }
            goto LAB_004500f4;
          }
          goto LAB_00450107;
        }
        auVar1._8_8_ = 0;
        auVar1[0] = protobuf[8];
        auVar1[1] = protobuf[9];
        auVar1[2] = protobuf[10];
        auVar1[3] = protobuf[0xb];
        auVar1[4] = protobuf[0xc];
        auVar1[5] = protobuf[0xd];
        auVar1[6] = protobuf[0xe];
        auVar1[7] = protobuf[0xf];
        protobuf = (char  [16])(auVar1 << 0x40);
        userp = (char *)0x0;
        CVar8 = parse_login_details((char *)__s,(long)pcVar17 - (long)__s,(char **)protobuf,&userp,
                                    (char **)0x0);
        if (CVar8 == CURLE_OK) {
          (*Curl_cfree)(pcVar13->proxyuser);
          pcVar13->proxyuser = (char *)0x0;
          string = protobuf._0_8_;
          if ((protobuf._0_8_ == 0) || (sVar20 = strlen((char *)protobuf._0_8_), 0xff < sVar20)) {
            pcVar18 = (*Curl_cstrdup)("");
          }
          else {
            pcVar18 = curl_easy_unescape(data,(char *)string,0,(int *)0x0);
          }
          pcVar13->proxyuser = pcVar18;
          CVar8 = CURLE_OUT_OF_MEMORY;
          if (pcVar18 != (char *)0x0) {
            (*Curl_cfree)(pcVar13->proxypasswd);
            pcVar18 = userp;
            pcVar13->proxypasswd = (char *)0x0;
            if ((userp == (char *)0x0) || (sVar20 = strlen(userp), 0xff < sVar20)) {
              pcVar18 = (*Curl_cstrdup)("");
            }
            else {
              pcVar18 = curl_easy_unescape(data,pcVar18,0,(int *)0x0);
            }
            pcVar13->proxypasswd = pcVar18;
            if (pcVar18 != (char *)0x0) {
              (pcVar13->bits).proxy_user_passwd = true;
              __s = (byte *)(pcVar17 + 1);
              CVar8 = CURLE_OK;
            }
          }
        }
        (*Curl_cfree)((void *)protobuf._0_8_);
        (*Curl_cfree)(userp);
        if (CVar8 == CURLE_OK) goto LAB_0044fdf8;
        goto LAB_00450158;
      }
      pcVar17 = curl_getenv("no_proxy");
      if (pcVar17 == (char *)0x0) {
        pcVar17 = curl_getenv("NO_PROXY");
      }
      _Var42 = check_noproxy((pcVar13->host).name,pcVar17);
      if (_Var42) {
        pbVar24 = (byte *)0x0;
      }
      else {
        pcVar18 = pcVar13->handler->scheme;
        for (lVar30 = 0; cVar6 = pcVar18[lVar30], cVar6 != '\0'; lVar30 = lVar30 + 1) {
          iVar9 = tolower((int)cVar6);
          protobuf[lVar30] = (char)iVar9;
        }
        builtin_strncpy(protobuf + lVar30,"_proxy",7);
        pbVar24 = (byte *)curl_getenv(protobuf);
        if (pbVar24 == (byte *)0x0) {
          iVar9 = Curl_raw_equal("http_proxy",protobuf);
          if (iVar9 == 0) {
            Curl_strntoupper(protobuf,protobuf,0x80);
            pbVar24 = (byte *)curl_getenv(protobuf);
            if (pbVar24 != (byte *)0x0) goto LAB_0044f693;
          }
          pbVar24 = (byte *)curl_getenv("all_proxy");
          if (pbVar24 == (byte *)0x0) {
            pbVar24 = (byte *)curl_getenv("ALL_PROXY");
          }
        }
      }
LAB_0044f693:
      (*Curl_cfree)(pcVar17);
      if (pbVar24 != (byte *)0x0) goto LAB_0044f6aa;
    }
    else {
LAB_0044f6ff:
      (*Curl_cfree)(pbVar24);
    }
    (pcVar13->bits).proxy = false;
    (pcVar13->bits).httpproxy = false;
    (pcVar13->bits).proxy_user_passwd = false;
    (pcVar13->bits).tunnel_proxy = false;
    bVar41 = true;
    goto LAB_0044f71d;
  }
  goto LAB_0044fd29;
  while (((((*ppuVar28)[bVar37] & 0x1400) != 0 || (bVar37 - 0x2d < 2)) ||
         ((bVar37 == 0x7e || (bVar37 == 0x5f))))) {
LAB_004500b1:
    __s_00 = __s_00 + 1;
    bVar37 = *__s_00;
    if ((ulong)bVar37 == 0) goto LAB_004500f4;
  }
LAB_004500e5:
  if (bVar37 == 0x5d) {
    *__s_00 = 0;
    __s_00 = __s_00 + 1;
  }
  else {
LAB_004500f4:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_00450107:
  pcVar17 = strchr((char *)__s_00,0x3a);
  if (pcVar17 == (char *)0x0) {
    if (*__s != 0x2f) {
      pcVar17 = strchr((char *)__s,0x2f);
      if (pcVar17 != (char *)0x0) {
        *pcVar17 = '\0';
      }
      lVar30 = (data->set).proxyport;
      if (lVar30 != 0) goto LAB_0045012a;
      goto LAB_00450131;
    }
    CVar8 = CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    *pcVar17 = '\0';
    lVar30 = strtol(pcVar17 + 1,(char **)0x0,10);
LAB_0045012a:
    pcVar13->port = lVar30;
LAB_00450131:
    pcVar17 = (*Curl_cstrdup)((char *)__s);
    (pcVar13->proxy).rawalloc = pcVar17;
    (pcVar13->proxy).name = pcVar17;
    CVar8 = CURLE_OUT_OF_MEMORY;
    if (pcVar17 != (char *)0x0) {
      CVar8 = CURLE_OK;
    }
  }
LAB_00450158:
  (*Curl_cfree)(pbVar24);
  if (CVar8 != CURLE_OK) goto LAB_0044ebc7;
  bVar40 = pcVar13->proxytype < 2;
  bVar41 = !bVar40;
  if (bVar40) {
    if (((pcVar13->handler->protocol & 3) == 0) && ((pcVar13->bits).tunnel_proxy == false)) {
      pcVar13->handler = &Curl_handler_http;
    }
    (pcVar13->bits).httpproxy = true;
  }
  else {
    (pcVar13->bits).httpproxy = false;
    (pcVar13->bits).tunnel_proxy = false;
  }
  (pcVar13->bits).proxy = true;
LAB_0044f71d:
  if ((!bVar41) && ((pcVar13->given->flags & 1) != 0)) {
    (pcVar13->bits).tunnel_proxy = true;
  }
  iVar9 = __isoc99_sscanf((pcVar13->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",&userp);
  if ((iVar9 == 1) && ((char)userp == ']')) {
    (pcVar13->bits).ipv6_ip = true;
    pcVar17 = (pcVar13->host).name + 1;
    (pcVar13->host).name = pcVar17;
    pcVar18 = strchr(pcVar17,0x5d);
    if (pcVar18 == (char *)0x0) {
      pcVar17 = (char *)0x0;
    }
    else {
      *pcVar18 = '\0';
      pcVar17 = (char *)0x0;
      if (pcVar18[1] == ':') {
        pcVar17 = pcVar18 + 1;
      }
    }
  }
  else {
    pcVar17 = strrchr((pcVar13->host).name,0x3a);
  }
  lVar30 = (data->set).use_port;
  if ((lVar30 == 0) || ((data->state).allow_port != true)) {
    if (pcVar17 != (char *)0x0) {
      uVar26 = strtol(pcVar17 + 1,(char **)protobuf,10);
      if (0xffff < uVar26) {
        Curl_failf(data,"Port number out of range");
        CVar8 = CURLE_URL_MALFORMAT;
        goto LAB_0044ebc7;
      }
      *pcVar17 = '\0';
      if ((char *)protobuf._0_8_ != pcVar17 + 1) {
        uVar7 = curlx_ultous(uVar26);
        pcVar13->remote_port = (uint)uVar7;
      }
    }
  }
  else {
    pcVar13->remote_port = (uint)lVar30 & 0xffff;
    if (pcVar17 != (char *)0x0) {
      *pcVar17 = '\0';
    }
    if ((pcVar13->bits).httpproxy == true) {
      protobuf[8] = '\0';
      protobuf[9] = '\0';
      protobuf[10] = '\0';
      protobuf[0xb] = '\0';
      auVar5._8_8_ = 0;
      auVar5[0] = protobuf[8];
      auVar5[1] = protobuf[9];
      auVar5[2] = protobuf[10];
      auVar5[3] = protobuf[0xb];
      auVar5[4] = protobuf[0xc];
      auVar5[5] = protobuf[0xd];
      auVar5[6] = protobuf[0xe];
      auVar5[7] = protobuf[0xf];
      protobuf = (char  [16])(auVar5 << 0x40);
      if ((pcVar13->bits).type_set == true) {
        if ((data->set).prefer_ascii == false) {
          uVar26 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
        }
        else {
          uVar26 = 0x41;
        }
        curl_msnprintf(protobuf,0xc,";type=%c",uVar26);
      }
      pcVar17 = "[";
      bVar41 = (pcVar13->bits).ipv6_ip == false;
      if (bVar41) {
        pcVar17 = "";
      }
      pcVar18 = "]";
      if (bVar41) {
        pcVar18 = "";
      }
      pcVar19 = "/";
      if ((data->state).slash_removed == false) {
        pcVar19 = "";
      }
      pcVar17 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",pcVar13->given->scheme,pcVar17,
                              (pcVar13->host).name,pcVar18,(ulong)(uint)pcVar13->remote_port,pcVar19
                              ,(data->state).path,protobuf);
      if (pcVar17 == (char *)0x0) goto LAB_0044fd29;
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      (data->change).url = pcVar17;
      (data->change).url_alloc = true;
    }
  }
  if ((data->set).str[0x1c] != (char *)0x0) {
    (*Curl_cfree)(user);
    user = (*Curl_cstrdup)((data->set).str[0x1c]);
    if (user == (char *)0x0) goto LAB_0044fd29;
  }
  if ((data->set).str[0x1d] != (char *)0x0) {
    (*Curl_cfree)(passwd);
    passwd = (*Curl_cstrdup)((data->set).str[0x1d]);
    if (passwd == (char *)0x0) goto LAB_0044fd29;
  }
  if ((data->set).str[0x1e] != (char *)0x0) {
    (*Curl_cfree)(pcVar14);
    pcVar14 = (*Curl_cstrdup)((data->set).str[0x1e]);
    if (pcVar14 == (char *)0x0) {
      pcVar14 = (char *)0x0;
      goto LAB_0044fd29;
    }
  }
  (pcVar13->bits).netrc = false;
  if ((data->set).use_netrc != CURL_NETRC_IGNORED) {
    iVar9 = Curl_parsenetrc((pcVar13->host).name,&user,&passwd,(data->set).str[0xe]);
    if (iVar9 < 1) {
      if (iVar9 < 0) goto LAB_0044fd29;
      (pcVar13->bits).netrc = true;
      (pcVar13->bits).user_passwd = true;
    }
    else {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (pcVar13->host).name);
    }
  }
  pcVar17 = passwd;
  if (((pcVar13->handler->flags & 0x20) == 0) || ((pcVar13->bits).user_passwd != false)) {
    pcVar18 = (*Curl_cstrdup)(user);
    pcVar13->user = pcVar18;
    if (pcVar18 == (char *)0x0) goto LAB_0044fb1b;
LAB_0044fb10:
    pcVar17 = (*Curl_cstrdup)(pcVar17);
  }
  else {
    pcVar17 = (*Curl_cstrdup)("anonymous");
    pcVar13->user = pcVar17;
    if (pcVar17 != (char *)0x0) {
      pcVar17 = "ftp@example.com";
      goto LAB_0044fb10;
    }
LAB_0044fb1b:
    pcVar17 = (char *)0x0;
  }
  pcVar13->passwd = pcVar17;
  if ((pcVar13->user != (char *)0x0) && (pcVar17 != (char *)0x0)) {
    if (*pcVar14 != '\0') {
      pcVar17 = (*Curl_cstrdup)(pcVar14);
      pcVar13->options = pcVar17;
      if (pcVar17 == (char *)0x0) goto LAB_0044fd29;
    }
    pSVar35 = pcVar13->data;
    Curl_free_request_state(pSVar35);
    memset(&pSVar35->req,0,0x138);
    (pSVar35->req).maxdownload = -1;
    pcVar13->socktype = 1;
    pCVar27 = pcVar13->handler;
    if (pCVar27->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
      CVar8 = (*pCVar27->setup_connection)(pcVar13);
      if (CVar8 != CURLE_OK) goto LAB_0044ebc7;
      pCVar27 = pcVar13->handler;
    }
    if (pcVar13->port < 0) {
      pcVar13->port = pCVar27->defport;
    }
    if (pcVar13->remote_port < 0) {
      pcVar13->remote_port = (uint)(ushort)pcVar13->given->defport;
    }
    pcVar13->recv[0] = Curl_recv_plain;
    pcVar13->send[0] = Curl_send_plain;
    pcVar13->recv[1] = Curl_recv_plain;
    pcVar13->send[1] = Curl_send_plain;
    if ((pCVar27->flags & 0x10) != 0) {
      CVar10 = (*pCVar27->connect_it)(pcVar13,(_Bool *)protobuf);
      if (CVar10 == CURLE_OK) {
        pcVar13->data = data;
        (pcVar13->bits).tcpconnect[0] = true;
        Curl_conncache_add_conn((data->state).conn_cache,pcVar13);
        CVar8 = setup_range(data);
        if (CVar8 != CURLE_OK) {
          (*pcVar13->handler->done)(pcVar13,CVar8,false);
          goto LAB_0044ebc7;
        }
        Curl_setup_transfer(pcVar13,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      }
      Curl_init_do(data,pcVar13);
      CVar8 = CVar10;
      goto LAB_0044ebc7;
    }
    pcVar17 = (data->set).str[0x14];
    (data->set).ssl.CApath = (data->set).str[0x13];
    (data->set).ssl.CAfile = pcVar17;
    pcVar17 = (data->set).str[0x1b];
    (data->set).ssl.CRLfile = (data->set).str[0x1a];
    (data->set).ssl.issuercert = pcVar17;
    auVar1 = *(undefined1 (*) [16])((data->set).str + 0x17);
    auVar43._0_8_ = auVar1._8_8_;
    auVar43._8_4_ = auVar1._0_4_;
    auVar43._12_4_ = auVar1._4_4_;
    (data->set).ssl.random_file = (char *)auVar43._0_8_;
    (data->set).ssl.egdsocket = (char *)auVar43._8_8_;
    (data->set).ssl.cipher_list = (data->set).str[0x16];
    local_248 = &local_288->ssl_config;
    _Var42 = Curl_clone_ssl_config(&(data->set).ssl,local_248);
    if (!_Var42) goto LAB_0044fd29;
    tVar44 = curlx_tvnow();
    lVar30 = curlx_tvdiff(tVar44,((data->state).conn_cache)->last_cleanup);
    if (999 < lVar30) {
      Curl_conncache_foreach((data->state).conn_cache,data,call_disconnect_if_dead);
      ((data->state).conn_cache)->last_cleanup = tVar44;
    }
    if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
LAB_00450712:
      pcVar29 = Curl_conncache_find_bundle(pcVar13,(data->state).conn_cache);
      if ((pcVar29 == (connectbundle *)0x0 || local_270 == 0) ||
         (pcVar29->num_connections < local_270)) {
LAB_004509ef:
        connc = (data->state).conn_cache;
        if ((local_260 != 0) && (local_260 <= connc->num_connections)) {
          pcVar33 = find_oldest_idle_connection(data);
          if (pcVar33 == (connectdata *)0x0) {
            pcVar17 = "No connections available in cache\n";
            goto LAB_00450b8f;
          }
          pcVar33->data = data;
          Curl_disconnect(pcVar33,false);
          connc = (data->state).conn_cache;
        }
        Curl_conncache_add_conn(connc,pcVar13);
        conn = pcVar13;
LAB_00450a48:
        conn->inuse = true;
        Curl_init_do(data,conn);
        CVar8 = setup_range(data);
        if (CVar8 != CURLE_OK) goto LAB_0044ebc7;
        conn->seek_func = (data->set).seek_func;
        conn->seek_client = (data->set).seek_client;
        lVar30 = Curl_timeleft(data,(timeval *)0x0,true);
        if ((conn->bits).reuse == true) {
          *local_268 = false;
          CVar8 = CURLE_OK;
          goto LAB_0044ebc7;
        }
        fix_hostname(data,(connectdata *)&conn->host,host_00);
        pcVar17 = (conn->proxy).name;
        if ((pcVar17 == (char *)0x0) || (*pcVar17 == '\0')) {
          conn->port = (long)conn->remote_port;
          iVar9 = Curl_resolv_timeout(conn,(conn->host).name,conn->remote_port,
                                      (Curl_dns_entry **)protobuf,lVar30);
          if (iVar9 == -2) goto LAB_00450be3;
          if (iVar9 == 1) goto LAB_00450b7b;
          if (protobuf._0_8_ == 0) {
            CVar8 = CURLE_COULDNT_RESOLVE_HOST;
            pcVar17 = (conn->host).dispname;
            pcVar18 = "Couldn\'t resolve host \'%s\'";
            goto LAB_00450c17;
          }
LAB_00450bf3:
          CVar8 = CURLE_OK;
        }
        else {
          fix_hostname(data,(connectdata *)&conn->proxy,host_01);
          iVar9 = Curl_resolv_timeout(conn,(conn->proxy).name,(int)conn->port,
                                      (Curl_dns_entry **)protobuf,lVar30);
          if (iVar9 == -2) {
LAB_00450be3:
            CVar8 = CURLE_OPERATION_TIMEDOUT;
          }
          else {
            if (iVar9 == 1) {
LAB_00450b7b:
              *local_268 = true;
              goto LAB_00450bf3;
            }
            if (protobuf._0_8_ != 0) goto LAB_00450bf3;
            CVar8 = CURLE_COULDNT_RESOLVE_PROXY;
            pcVar17 = (conn->proxy).dispname;
            pcVar18 = "Couldn\'t resolve proxy \'%s\'";
LAB_00450c17:
            Curl_failf(data,pcVar18,pcVar17);
          }
        }
        conn->dns_entry = (Curl_dns_entry *)protobuf._0_8_;
        goto LAB_0044ebc7;
      }
      lVar30 = -1;
      tVar44 = curlx_tvnow();
      pcVar15 = pcVar29->conn_list;
      pcVar33 = (connectdata *)0x0;
      while( true ) {
        local_2a8 = tVar44.tv_usec;
        local_288 = (connectdata *)tVar44.tv_sec;
        pcVar31 = pcVar15->head;
        if (pcVar31 == (curl_llist_element *)0x0) break;
        pcVar34 = (connectdata *)pcVar31->ptr;
        if ((pcVar34->inuse == false) &&
           (lVar32 = curlx_tvdiff(tVar44,pcVar34->now), lVar30 < lVar32)) {
          pcVar33 = pcVar34;
          lVar30 = lVar32;
        }
        tVar44.tv_usec = local_2a8;
        tVar44.tv_sec = (__time_t)local_288;
        pcVar15 = (curl_llist *)&pcVar31->next;
      }
      if (pcVar33 != (connectdata *)0x0) {
        pcVar33->data = data;
        Curl_disconnect(pcVar33,false);
        goto LAB_004509ef;
      }
      Curl_infof(data,"No more connections allowed to host: %d\n",local_270);
    }
    else {
      _Var42 = IsPipeliningPossible(data,pcVar13);
      if (_Var42) {
        _Var42 = Curl_pipeline_site_blacklisted(data,pcVar13);
        bVar41 = !_Var42;
      }
      else {
        bVar41 = false;
      }
      pcVar29 = Curl_conncache_find_bundle(pcVar13,(data->state).conn_cache);
      if (pcVar29 == (connectbundle *)0x0) goto LAB_00450712;
      if ((pcVar29->multiuse == 2) || (data->multi == (Curl_multi *)0x0)) {
        local_278 = 0;
      }
      else {
        local_278 = data->multi->max_pipeline_length;
      }
      bVar40 = false;
      Curl_infof(data,"Found bundle for host %s: %p\n",(pcVar13->host).name,pcVar29);
      if (!bVar41) {
LAB_00450245:
        local_288 = (connectdata *)&local_288->user;
        local_2b0 = pcVar29->conn_list->head;
        local_240 = local_278 - 1;
        uVar26 = local_278;
        pcVar34 = (connectdata *)0x0;
LAB_0045027a:
        while( true ) {
          do {
            if (local_2b0 == (curl_llist_element *)0x0) {
              conn = pcVar34;
              if (pcVar34 == (connectdata *)0x0) goto LAB_00450712;
              goto LAB_00450680;
            }
            conn = (connectdata *)local_2b0->ptr;
            local_2b0 = local_2b0->next;
            _Var42 = disconnect_if_dead(conn,data);
          } while (_Var42);
          pcVar15 = conn->recv_pipe;
          uVar36 = pcVar15->size + conn->send_pipe->size;
          if (bVar40) break;
          if (uVar36 == 0) {
            if ((conn->sock[0] != -1) && ((conn->bits).close != true)) goto LAB_00450343;
            uVar36 = conn->connection_id;
            pcVar17 = "Connection #%ld isn\'t open enough, can\'t reuse\n";
LAB_00450317:
            Curl_infof(data,pcVar17,uVar36);
          }
        }
        if ((conn->bits).multiplex == false) {
          pcVar31 = conn->send_pipe->head;
          if (pcVar31 == (curl_llist_element *)0x0) {
            pcVar31 = pcVar15->head;
            if (pcVar31 != (curl_llist_element *)0x0) {
LAB_0045032b:
              pSVar35 = (SessionHandle *)pcVar31->ptr;
              goto LAB_0045032e;
            }
          }
          else {
            pSVar35 = (SessionHandle *)pcVar31->ptr;
            pcVar31 = pcVar15->head;
            if (pcVar31 == (curl_llist_element *)0x0) {
LAB_0045032e:
              if (pSVar35 == (SessionHandle *)0x0) goto LAB_00450343;
            }
            else if (pSVar35 == (SessionHandle *)0x0) goto LAB_0045032b;
            _Var42 = IsPipeliningPossible(pSVar35,conn);
            if (!_Var42) goto LAB_0045027a;
          }
        }
LAB_00450343:
        pCVar27 = pcVar13->handler;
        uVar2 = pCVar27->flags;
        if ((((((conn->handler->flags ^ uVar2) & 1) != 0) &&
             ((pCVar27->protocol & conn->handler->protocol) == 0)) ||
            (((uVar2 & 1) != 0 &&
             (((data->set).ssl.verifypeer != conn->verifypeer ||
              ((data->set).ssl.verifyhost != conn->verifyhost)))))) ||
           (((pcVar13->bits).proxy != (conn->bits).proxy || ((!bVar40 && (conn->inuse != false))))))
        goto LAB_0045027a;
        pcVar17 = pcVar13->localdev;
        if ((pcVar17 != (char *)0x0 || pcVar13->localport != 0) &&
           ((((conn->localport != pcVar13->localport ||
              (conn->localportrange != pcVar13->localportrange)) || (pcVar17 == (char *)0x0)) ||
            ((conn->localdev == (char *)0x0 || (iVar9 = strcmp(conn->localdev,pcVar17), iVar9 != 0))
            )))) goto LAB_0045027a;
        if (-1 < (char)uVar2) {
          iVar9 = curl_strequal((char *)local_288->data,conn->user);
          if ((iVar9 == 0) || (iVar9 = curl_strequal(pcVar13->passwd,conn->passwd), iVar9 == 0))
          goto LAB_0045027a;
          pCVar27 = pcVar13->handler;
        }
        if (((pcVar13->bits).httpproxy == true) && ((pCVar27->flags & 1) == 0)) {
          if ((((conn->bits).httpproxy == true) &&
              ((((pcVar13->bits).tunnel_proxy == true && ((conn->bits).tunnel_proxy == true)) &&
               (iVar9 = Curl_raw_equal((pcVar13->proxy).name,(conn->proxy).name), iVar9 != 0)))) &&
             (pcVar13->port == conn->port)) {
            pCVar27 = pcVar13->handler;
            goto LAB_004504d7;
          }
          if ((((conn->bits).proxy == true) && (pcVar13->proxytype == conn->proxytype)) &&
             (((pcVar13->bits).tunnel_proxy == (conn->bits).tunnel_proxy &&
              ((iVar9 = Curl_raw_equal((pcVar13->proxy).name,(conn->proxy).name), iVar9 != 0 &&
               (pcVar13->port == conn->port)))))) {
LAB_00450541:
            if (!(bool)(bVar40 & uVar36 != 0)) goto LAB_00450680;
LAB_004505ef:
            if (local_240 < uVar36) {
              pcVar17 = "Pipe is full, skip (%zu)\n";
              goto LAB_00450317;
            }
            _Var42 = Curl_pipeline_penalized(data,conn);
            if (_Var42) {
              Curl_infof(data,"Penalized, skip\n");
            }
            else {
              if (local_278 == 0) {
                Curl_infof(data,"Multiplexed connection found!\n");
                goto LAB_00450680;
              }
              if (uVar36 < uVar26) {
                uVar26 = uVar36;
                pcVar34 = conn;
              }
            }
          }
          goto LAB_0045027a;
        }
LAB_004504d7:
        iVar9 = Curl_raw_equal(pCVar27->scheme,conn->handler->scheme);
        if (((iVar9 == 0) && ((pcVar13->handler->protocol & conn->handler->protocol) == 0)) ||
           ((iVar9 = Curl_raw_equal((pcVar13->host).name,(conn->host).name), iVar9 == 0 ||
            (pcVar13->remote_port != conn->remote_port)))) goto LAB_0045027a;
        if ((pcVar13->handler->flags & 1) == 0) goto LAB_00450541;
        _Var42 = Curl_ssl_config_matches(local_248,&conn->ssl_config);
        if (!_Var42) goto LAB_0045027a;
        sVar3 = conn->ssl[0].state;
        if ((bool)(bVar40 & sVar3 == ssl_connection_complete)) {
          if (uVar36 != 0) goto LAB_004505ef;
          goto LAB_00450680;
        }
        if (sVar3 != ssl_connection_complete) goto LAB_0045027a;
LAB_00450680:
        _Var42 = IsPipeliningPossible(data,conn);
        if ((((_Var42) && (conn->recv_pipe->size + conn->send_pipe->size != 0)) &&
            (Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                        conn->connection_id), conn->bundle->num_connections < local_270)) &&
           (((data->state).conn_cache)->num_connections < local_260)) {
          Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
          goto LAB_00450712;
        }
        conn->inuse = true;
        (*Curl_cfree)((pcVar13->proxy).rawalloc);
        Curl_free_ssl_config(local_248);
        conn->data = pcVar13->data;
        _Var42 = (pcVar13->bits).user_passwd;
        (conn->bits).user_passwd = _Var42;
        if (_Var42 == true) {
          (*Curl_cfree)(conn->user);
          conn->user = (char *)0x0;
          (*Curl_cfree)(conn->passwd);
          conn->passwd = (char *)0x0;
          pcVar17 = *(char **)(local_288->chunk).hexbuffer;
          conn->user = (char *)local_288->data;
          conn->passwd = pcVar17;
          local_288->data = (SessionHandle *)0x0;
          (local_288->chunk).hexbuffer[0] = '\0';
          (local_288->chunk).hexbuffer[1] = '\0';
          (local_288->chunk).hexbuffer[2] = '\0';
          (local_288->chunk).hexbuffer[3] = '\0';
          (local_288->chunk).hexbuffer[4] = '\0';
          (local_288->chunk).hexbuffer[5] = '\0';
          (local_288->chunk).hexbuffer[6] = '\0';
          (local_288->chunk).hexbuffer[7] = '\0';
        }
        _Var42 = (pcVar13->bits).proxy_user_passwd;
        (conn->bits).proxy_user_passwd = _Var42;
        if (_Var42 == true) {
          (*Curl_cfree)(conn->proxyuser);
          conn->proxyuser = (char *)0x0;
          (*Curl_cfree)(conn->proxypasswd);
          conn->proxypasswd = (char *)0x0;
          pcVar17 = pcVar13->proxypasswd;
          conn->proxyuser = pcVar13->proxyuser;
          conn->proxypasswd = pcVar17;
          pcVar13->proxyuser = (char *)0x0;
          pcVar13->proxypasswd = (char *)0x0;
        }
        (*Curl_cfree)((conn->host).rawalloc);
        (conn->host).rawalloc = (char *)0x0;
        pcVar17 = local_280->rawalloc;
        pcVar18 = local_280->encalloc;
        pcVar19 = local_280->dispname;
        (conn->host).name = local_280->name;
        (conn->host).dispname = pcVar19;
        (conn->host).rawalloc = pcVar17;
        (conn->host).encalloc = pcVar18;
        Curl_persistconninfo(conn);
        (conn->bits).reuse = true;
        (*Curl_cfree)(pcVar13->user);
        pcVar13->user = (char *)0x0;
        (*Curl_cfree)(pcVar13->passwd);
        pcVar13->passwd = (char *)0x0;
        (*Curl_cfree)(pcVar13->proxyuser);
        pcVar13->proxyuser = (char *)0x0;
        (*Curl_cfree)(pcVar13->proxypasswd);
        pcVar13->proxypasswd = (char *)0x0;
        (*Curl_cfree)(pcVar13->localdev);
        pcVar13->localdev = (char *)0x0;
        Curl_llist_destroy(pcVar13->send_pipe,(void *)0x0);
        Curl_llist_destroy(pcVar13->recv_pipe,(void *)0x0);
        pcVar33->send_pipe = (curl_llist *)0x0;
        pcVar33->recv_pipe = (curl_llist *)0x0;
        (*Curl_cfree)(pcVar13->master_buffer);
        pcVar13->master_buffer = (char *)0x0;
        (*Curl_cfree)(pcVar13);
        *in_connect = conn;
        fix_hostname(data,(connectdata *)&conn->host,host);
        pcVar17 = "host";
        if ((conn->bits).proxy != false) {
          pcVar17 = "proxy";
        }
        Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",conn->connection_id,
                   pcVar17,*(undefined8 *)
                            (conn->primary_ip +
                            (ulong)((conn->proxy).name != (char *)0x0) * 0x20 + -0x34));
        goto LAB_00450a48;
      }
      bVar40 = true;
      if (0 < pcVar29->multiuse) goto LAB_00450245;
      if ((pcVar29->multiuse != 0) || ((data->set).pipewait == false)) {
        bVar40 = false;
        Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
        goto LAB_00450245;
      }
      pcVar17 = "Server doesn\'t support multi-use yet, wait\n";
LAB_00450b8f:
      Curl_infof(data,pcVar17);
    }
    Curl_infof(data,"No connections available.\n");
    conn_free(pcVar13);
    *in_connect = (connectdata *)0x0;
    CVar8 = CURLE_NO_CONNECTION_AVAILABLE;
    goto LAB_0044ebc7;
  }
LAB_0044fd29:
  CVar8 = CURLE_OUT_OF_MEMORY;
LAB_0044ebc7:
  (*Curl_cfree)(pcVar14);
  (*Curl_cfree)(passwd);
  (*Curl_cfree)(user);
  (*Curl_cfree)((void *)0x0);
  if (CVar8 == CURLE_OK) {
    pcVar13 = *in_connect;
    if ((pcVar13->send_pipe->size != 0) || (pcVar13->recv_pipe->size != 0)) {
      *protocol_done = true;
      return CURLE_OK;
    }
    if (*local_268 != false) {
      return CURLE_OK;
    }
    CVar8 = Curl_setup_conn(pcVar13,protocol_done);
  }
  if (CVar8 != CURLE_OK) {
    if (CVar8 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar8 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(*in_connect,false);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar8;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}